

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

string * util::lowercase(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  size_type sVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar2 = str->_M_string_length;
  if (sVar2 != 0) {
    pcVar1 = (str->_M_dataplus)._M_p;
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar4 = tolower((int)pcVar1[sVar5]);
      pcVar3[sVar5] = (char)iVar4;
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string lowercase(const std::string& str)
{
    std::string ret = str;
    ret.reserve(str.length());
    std::transform(str.cbegin(), str.cend(), ret.begin(), [](char c) {
        return static_cast<uint8_t>(std::tolower(static_cast<int>(c)));
        });
    return ret;
}